

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O1

void Aig_RManRecord(uint *pTruth,int nVarsInit)

{
  uint *__src;
  Kit_DsdObj_t KVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  Aig_RMan_t *pAVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  Kit_DsdNtk_t *pNtk;
  Kit_DsdObj_t *pKVar9;
  ulong uVar10;
  uint nVars;
  void *__src_00;
  char *__s;
  ulong uVar11;
  uint iVar;
  
  if (0xc < nVarsInit) {
    __s = "The number of variables in too large.";
LAB_006ad37b:
    puts(__s);
    return;
  }
  if (s_pRMan == (Aig_RMan_t *)0x0) {
    s_pRMan = Aig_RManStart();
  }
  s_pRMan->nTotal = s_pRMan->nTotal + 1;
  pNtk = Kit_DsdDecompose(pTruth,nVarsInit);
  pKVar9 = Kit_DsdNonDsdPrimeMax(pNtk);
  pAVar5 = s_pRMan;
  if (pKVar9 != (Kit_DsdObj_t *)0x0) {
    KVar1 = *pKVar9;
    nVars = (uint)KVar1 >> 0x1a;
    if (nVars != 3) {
      s_pRMan->nVarFuncs[nVars] = s_pRMan->nVarFuncs[nVars] + 1;
      if ((int)nVars < nVarsInit) {
        pAVar5->nTtDsdPart = pAVar5->nTtDsdPart + 1;
      }
      else {
        pAVar5->nTtDsdNot = pAVar5->nTtDsdNot + 1;
      }
      uVar6 = 1 << ((KVar1._3_1_ >> 2) - 5 & 0x1f);
      if ((uint)KVar1 < 0x18000000) {
        uVar6 = 1;
      }
      __src_00 = (void *)0x0;
      if (((uint)*pKVar9 & 0x1c0) == 0x140) {
        __src_00 = &pKVar9[1].field_0x0 + ((uint)*pKVar9 >> 8 & 0x3fc);
      }
      memcpy(pAVar5->pTruthInit,__src_00,(long)(int)(uVar6 * 4));
      Kit_DsdNtkFree(pNtk);
      pAVar5 = s_pRMan;
      __src = s_pRMan->pTruthInit;
      uVar11 = (ulong)uVar6;
      if (((s_pRMan->pTruthInit[0] & 1) != 0) && (uVar10 = uVar11, 0 < (int)uVar6)) {
        do {
          pAVar5->pTruthInit[uVar10 - 1] = ~pAVar5->pTruthInit[uVar10 - 1];
          bVar2 = 1 < (long)uVar10;
          uVar10 = uVar10 - 1;
        } while (bVar2);
      }
      memcpy(pAVar5->pTruth,__src,(long)(int)(uVar6 * 4));
      if (0x3ffffff < (uint)KVar1) {
        uVar10 = 0;
        do {
          pAVar5->pPerm[uVar10] = (char)uVar10;
          uVar10 = uVar10 + 1;
        } while (nVars != uVar10);
      }
      uVar6 = Aig_RManSemiCanonicize
                        (pAVar5->pTruthTemp,pAVar5->pTruth,nVars,pAVar5->pPerm,pAVar5->pMints,1);
      pAVar5 = s_pRMan;
      iVar7 = Aig_RManVarsAreUnique(s_pRMan->pMints,nVars);
      pAVar5->nUniqueVars = pAVar5->nUniqueVars + iVar7;
      iVar8 = Aig_RManTableFindOrAdd(pAVar5,pAVar5->pTruth,nVars);
      if (iVar8 != 0) {
        Aig_RManSaveOne(s_pRMan,s_pRMan->pTruth,nVars);
      }
      pAVar5 = s_pRMan;
      if (0x3ffffff < (uint)KVar1) {
        uVar10 = 0;
        do {
          pAVar5->pPermR[uVar10] = pAVar5->pPerm[uVar10];
          uVar10 = uVar10 + 1;
        } while (nVars != uVar10);
      }
      Kit_TruthPermute(s_pRMan->pTruthTemp,s_pRMan->pTruth,nVars,s_pRMan->pPermR,1);
      if (0x3ffffff < (uint)KVar1) {
        iVar = 0;
        do {
          if ((uVar6 >> (iVar & 0x1f) & 1) != 0) {
            Kit_TruthChangePhase(s_pRMan->pTruth,nVars,iVar);
          }
          iVar = iVar + 1;
        } while (nVars != iVar);
      }
      if (iVar7 != 0) {
        do {
          iVar7 = (int)uVar11;
          if (iVar7 < 1) {
            return;
          }
          lVar3 = uVar11 - 1;
          lVar4 = uVar11 - 1;
          uVar11 = uVar11 - 1;
        } while (s_pRMan->pTruth[lVar3] == s_pRMan->pTruthInit[lVar4]);
        if (0 < iVar7) {
          __s = "Verification failed.";
          goto LAB_006ad37b;
        }
      }
      return;
    }
  }
  s_pRMan->nTtDsd = s_pRMan->nTtDsd + 1;
  Kit_DsdNtkFree(pNtk);
  return;
}

Assistant:

void Aig_RManRecord( unsigned * pTruth, int nVarsInit )
{
    int fVerify = 1;
    Kit_DsdNtk_t * pNtk;
    Kit_DsdObj_t * pObj;
    unsigned uPhaseC;
    int i, nVars, nWords;
    int fUniqueVars;

    if ( nVarsInit > RMAN_MAXVARS )
    {
        printf( "The number of variables in too large.\n" );
        return;
    }

    if ( s_pRMan == NULL )
        s_pRMan = Aig_RManStart();
    s_pRMan->nTotal++;
    // canonicize the function
    pNtk = Kit_DsdDecompose( pTruth, nVarsInit );
    pObj = Kit_DsdNonDsdPrimeMax( pNtk );
    if ( pObj == NULL || pObj->nFans == 3 )
    {
        s_pRMan->nTtDsd++;
        Kit_DsdNtkFree( pNtk );
        return;
    }
    nVars = pObj->nFans;
    s_pRMan->nVarFuncs[nVars]++;
    if ( nVars < nVarsInit )
        s_pRMan->nTtDsdPart++;
    else
        s_pRMan->nTtDsdNot++;
    // compute the number of words
    nWords = Abc_TruthWordNum( nVars );
    // copy the function
    memcpy( s_pRMan->pTruthInit, Kit_DsdObjTruth(pObj), (size_t)(4*nWords) );
    Kit_DsdNtkFree( pNtk );
    // canonicize the output
    if ( s_pRMan->pTruthInit[0] & 1 )
        Kit_TruthNot( s_pRMan->pTruthInit, s_pRMan->pTruthInit, nVars );
    memcpy( s_pRMan->pTruth, s_pRMan->pTruthInit, 4*nWords );

    // canonize the function
    for ( i = 0; i < nVars; i++ )
        s_pRMan->pPerm[i] = i;
    uPhaseC = Aig_RManSemiCanonicize( s_pRMan->pTruthTemp, s_pRMan->pTruth, nVars, s_pRMan->pPerm, s_pRMan->pMints, 1 );
    // check unique variables
    fUniqueVars = Aig_RManVarsAreUnique( s_pRMan->pMints, nVars );
    s_pRMan->nUniqueVars += fUniqueVars;

/*
    printf( "%4d : ", s_pRMan->nTotal );
    printf( "%2d %2d  ", nVarsInit, nVars );
    Extra_PrintBinary( stdout, &uPhaseC, nVars );
    printf( "  " );
    for ( i = 0; i < nVars; i++ )
        printf( "%2d/%2d ", s_pRMan->pMints[2*i], s_pRMan->pMints[2*i+1] );
    printf( "\n" );
    Aig_RManPrintUniqueVars( s_pRMan->pMints, nVars );
Extra_PrintBinary( stdout, s_pRMan->pTruth, 1<<nVars ); printf( "\n\n" );
*/
/*
    printf( "\n" );
    printf( "%4d : ", s_pRMan->nTotal );
    printf( "%2d %2d  ", nVarsInit, nVars );
    printf( "   " );
    printf( "\n" );
    Aig_RManPrintUniqueVars( s_pRMan->pMints, nVars );
//    Aig_RManPrintSigs( s_pRMan->pMints, nVars );
*/

//Extra_PrintBinary( stdout, s_pRMan->pTruth, 1<<nVars ); printf( "\n\n" );

    if ( Aig_RManTableFindOrAdd( s_pRMan, s_pRMan->pTruth, nVars ) )
        Aig_RManSaveOne( s_pRMan, s_pRMan->pTruth, nVars );

    if ( fVerify )
    {
        // derive reverse permutation
        for ( i = 0; i < nVars; i++ )
            s_pRMan->pPermR[i] = s_pRMan->pPerm[i];
        // implement permutation
        Kit_TruthPermute( s_pRMan->pTruthTemp, s_pRMan->pTruth, nVars, s_pRMan->pPermR, 1 );
        // implement polarity
        for ( i = 0; i < nVars; i++ )
            if ( uPhaseC & (1 << i) )
                Kit_TruthChangePhase( s_pRMan->pTruth, nVars, i );

        // perform verification
        if ( fUniqueVars && !Kit_TruthIsEqual( s_pRMan->pTruth, s_pRMan->pTruthInit, nVars ) )
            printf( "Verification failed.\n" );
    }
//Aig_RManPrintVarProfile( s_pRMan->pTruth, nVars, s_pRMan->pTruthTemp );
//Extra_PrintBinary( stdout, s_pRMan->pTruth, 1<<nVars ); printf( "\n" );
}